

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

void Dar_BalancePermute(Aig_Man_t *p,Vec_Ptr_t *vSuper,int LeftBound,int fExor)

{
  int i;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *Entry;
  Aig_Obj_t *Entry_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int i_00;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  
  i = vSuper->nSize + -2;
  if (i < LeftBound) {
    __assert_fail("LeftBound <= RightBound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                  ,0x118,"void Dar_BalancePermute(Aig_Man_t *, Vec_Ptr_t *, int, int)");
  }
  if (i != LeftBound) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,vSuper->nSize + -1);
    Entry = (Aig_Obj_t *)Vec_PtrEntry(vSuper,i);
    pObj = (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe);
    if (((p->pConst1 != pObj) && (pObj != (Aig_Obj_t *)((ulong)Entry & 0xfffffffffffffffe))) &&
       (p->pConst1 != (Aig_Obj_t *)((ulong)Entry & 0xfffffffffffffffe))) {
      for (i_00 = i; LeftBound <= i_00; i_00 = i_00 + -1) {
        Entry_00 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,i_00);
        pAVar5 = (Aig_Obj_t *)((ulong)Entry_00 & 0xfffffffffffffffe);
        if (p->pConst1 == pAVar5) goto LAB_0041f58e;
        if (pObj == pAVar5) {
LAB_0041f587:
          if (Entry_00 == Entry) {
            return;
          }
LAB_0041f58e:
          Vec_PtrWriteEntry(vSuper,i_00,Entry);
          Vec_PtrWriteEntry(vSuper,i,Entry_00);
          return;
        }
        if ((fExor == 0) && (iVar1 = Aig_ObjIsConst1(pObj), iVar1 != 0)) {
          __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x15d,
                        "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                       );
        }
        if (Entry_00 == (Aig_Obj_t *)0x0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          iVar1 = Aig_ObjIsConst1(pAVar5);
          if (iVar1 != 0) {
            __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x15e,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
        }
        if (pObj == pAVar5) {
          __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x15f,
                        "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                       );
        }
        *(ulong *)&(p->Ghost).field_0x18 =
             *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 6 - (ulong)(fExor == 0);
        if (Entry_00 == (Aig_Obj_t *)0x0) {
          pAVar3 = pAVar2;
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = Entry_00;
          pAVar4 = pAVar2;
          if (pObj->Id < pAVar5->Id) {
            pAVar3 = pAVar2;
            pAVar4 = Entry_00;
          }
        }
        (p->Ghost).pFanin0 = pAVar3;
        (p->Ghost).pFanin1 = pAVar4;
        pAVar5 = Aig_TableLookup(p,&p->Ghost);
        if (pAVar5 != (Aig_Obj_t *)0x0) goto LAB_0041f587;
      }
    }
  }
  return;
}

Assistant:

void Dar_BalancePermute( Aig_Man_t * p, Vec_Ptr_t * vSuper, int LeftBound, int fExor )
{
    Aig_Obj_t * pObj1, * pObj2, * pObj3, * pGhost;
    int RightBound, i;
    // get the right bound
    RightBound = Vec_PtrSize(vSuper) - 2;
    assert( LeftBound <= RightBound );
    if ( LeftBound == RightBound )
        return;
    // get the two last nodes
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, RightBound + 1 );
    pObj2 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, RightBound     );
    if ( Aig_Regular(pObj1) == p->pConst1 || Aig_Regular(pObj2) == p->pConst1 || Aig_Regular(pObj1) == Aig_Regular(pObj2) )
        return;
    // find the first node that can be shared
    for ( i = RightBound; i >= LeftBound; i-- )
    {
        pObj3 = (Aig_Obj_t *)Vec_PtrEntry( vSuper, i );
        if ( Aig_Regular(pObj3) == p->pConst1 )
        {
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
        if ( Aig_Regular(pObj1) == Aig_Regular(pObj3) )
        {
            if ( pObj3 == pObj2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
        pGhost = Aig_ObjCreateGhost( p, pObj1, pObj3, fExor? AIG_OBJ_EXOR : AIG_OBJ_AND );
        if ( Aig_TableLookup( p, pGhost ) )
        {
            if ( pObj3 == pObj2 )
                return;
            Vec_PtrWriteEntry( vSuper, i,          pObj2 );
            Vec_PtrWriteEntry( vSuper, RightBound, pObj3 );
            return;
        }
    }
/*
    // we did not find the node to share, randomize choice
    {
        int Choice = Aig_ManRandom(0) % (RightBound - LeftBound + 1);
        pObj3 = Vec_PtrEntry( vSuper, LeftBound + Choice );
        if ( pObj3 == pObj2 )
            return;
        Vec_PtrWriteEntry( vSuper, LeftBound + Choice, pObj2 );
        Vec_PtrWriteEntry( vSuper, RightBound,         pObj3 );
    }
*/
}